

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

void NscPushAssignment(CNscPStackEntry *pOut,NscPCode nCode,NscType nType,CNscPStackEntry *pLhs,
                      CNscPStackEntry *pRhs)

{
  size_t *psVar1;
  uint ulFlags;
  
  if ((((pLhs->m_nDataSize == 0) ||
       (psVar1 = (size_t *)pLhs->m_pauchData, *psVar1 != pLhs->m_nDataSize)) ||
      ((int)psVar1[1] != 0)) || (ulFlags = (uint)psVar1[5], (ulFlags & 0xbc) != 0)) {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorAssignLHSNotVariable);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_Error;
      return;
    }
  }
  else {
    if (((g_pCtx->m_fWarnOnAssignRHSIsAssignment == true) && ((pRhs->m_ulFlags & 0x800000) == 0)) &&
       ((pRhs->m_nDataSize != 0 &&
        ((*(size_t *)pRhs->m_pauchData == pRhs->m_nDataSize &&
         ((int)*(size_t *)((long)pRhs->m_pauchData + 8) - 0x14U < 0xc)))))) {
      CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedRHSAssign);
      psVar1 = (size_t *)pLhs->m_pauchData;
      ulFlags = (uint)psVar1[5];
    }
    CNscPStackEntry::PushAssignment
              (pOut,nCode,nType,*(NscType *)(psVar1 + 2),pRhs->m_nType,psVar1[3],(int)psVar1[4],
               *(int *)((long)psVar1 + 0x24),ulFlags,pRhs->m_pauchData,pRhs->m_nDataSize);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = nType;
      return;
    }
  }
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

void NscPushAssignment (CNscPStackEntry *pOut, NscPCode nCode,
	NscType nType, CNscPStackEntry *pLhs, CNscPStackEntry *pRhs)
{

	//
	// Validate 
	//

	if (!pLhs ->IsSimpleVariable ())
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorAssignLHSNotVariable);
		pOut ->SetType (NscType_Error);
		return;
	}

	//
	// If we are detecting the standard compiler's parser limitation with
	// nested assignments
	//

	if (g_pCtx ->GetWarnOnAssignRHSIsAssignment () && pRhs ->IsAssignment ())
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedRHSAssign);

	//
	// Create the pcode
	//

	NscPCodeVariable *pv = (NscPCodeVariable *) pLhs ->GetData ();
	pOut ->PushAssignment (nCode, nType, pv ->nSourceType, pRhs ->GetType (),
		pv ->nSymbol, pv ->nElement, pv ->nStackOffset, pv ->ulFlags, 
		pRhs ->GetData (), pRhs ->GetDataSize ());
	pOut ->SetType (nType);
	return;
}